

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O3

void __thiscall Diligent::FixedLinearAllocator::Free(FixedLinearAllocator *this)

{
  pointer pDVar1;
  
  if ((this->m_pDataStart != (uint8_t *)0x0) && (this->m_pAllocator != (IMemoryAllocator *)0x0)) {
    (*this->m_pAllocator->_vptr_IMemoryAllocator[1])();
  }
  this->m_pAllocator = (IMemoryAllocator *)0x0;
  this->m_DbgCurrAllocation = 0;
  this->m_ReservedSize = 0;
  this->m_CurrAlignment = 0;
  this->m_pDataStart = (uint8_t *)0x0;
  this->m_pCurrPtr = (uint8_t *)0x0;
  pDVar1 = (this->m_DbgAllocations).
           super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_DbgAllocations).
      super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pDVar1) {
    (this->m_DbgAllocations).
    super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar1;
  }
  this->m_DbgUsingExternalMemory = false;
  return;
}

Assistant:

void Free()
    {
        if (m_pDataStart != nullptr && m_pAllocator != nullptr)
        {
            m_pAllocator->Free(m_pDataStart);
        }
        Reset();
    }